

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.cpp
# Opt level: O2

Result wallet::feebumper::CommitTransaction
                 (CWallet *wallet,uint256 *txid,CMutableTransaction *mtx,
                 vector<bilingual_str,_std::allocator<bilingual_str>_> *errors,uint256 *bumped_txid)

{
  CWalletTx *wtx;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string original;
  string original_00;
  mapValue_t mapValue_00;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  orderForm;
  bool bVar4;
  Result RVar5;
  _Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true> _Var6;
  mapped_type *this;
  long in_FS_OFFSET;
  CTransactionRef tx_00;
  undefined8 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  __node_type *p_Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe88 [16];
  undefined1 local_168 [16];
  CTransactionRef tx;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  string local_138 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118;
  key_type local_e8;
  mapValue_t mapValue;
  string local_98 [32];
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock4,&wallet->cs_wallet,"wallet.cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/feebumper.cpp"
             ,0x166,false);
  RVar5 = MISC_ERROR;
  if ((errors->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (errors->super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar4 = base_blob<256U>::IsNull(&txid->super_base_blob<256U>);
    if (!bVar4) {
      _Var6._M_cur = (__node_type *)
                     std::
                     _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(wallet->mapWallet)._M_h,txid);
      if (_Var6._M_cur != (__node_type *)0x0) {
        wtx = (CWalletTx *)((long)_Var6._M_cur + 0x28);
        RVar5 = PreconditionChecks(wallet,wtx,false,errors);
        if (RVar5 == OK) {
          std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)&tx);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_Rb_tree(&mapValue._M_t,
                     (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)wtx);
          p_Var7 = _Var6._M_cur;
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_78.original,
                     (base_blob<256u> *)
                     (*(long *)((long)&((_Var6._M_cur)->
                                       super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                       ._M_storage._M_storage + 0x1b8) + 0x39));
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,"replaces_txid",(allocator<char> *)(local_168 + 0xf));
          this = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&mapValue,&local_e8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (this,&local_78.original);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_78);
          std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                     &stack0xfffffffffffffe90,
                     &tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>);
          _GLOBAL__N_1::std::_Rb_tree_header::_Rb_tree_header
                    ((_Rb_tree_header *)&local_118._M_impl.super__Rb_tree_header,
                     (_Rb_tree_header *)&mapValue._M_t._M_impl.super__Rb_tree_header);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&stack0xfffffffffffffe78,
                   (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&((_Var6._M_cur)->
                              super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                              ).
                              super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                              ._M_storage._M_storage + 0x50));
          mapValue_00._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = p_Var7;
          mapValue_00._M_t._M_impl._0_8_ = in_stack_fffffffffffffe68;
          mapValue_00._M_t._M_impl.super__Rb_tree_header._M_header._8_16_ =
               in_stack_fffffffffffffe78;
          mapValue_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               (_Base_ptr)in_stack_fffffffffffffe88._0_8_;
          mapValue_00._M_t._M_impl.super__Rb_tree_header._M_node_count =
               in_stack_fffffffffffffe88._8_8_;
          orderForm.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          orderForm.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_168._0_8_;
          orderForm.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_168._8_8_;
          tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_118;
          tx_00.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)&stack0xfffffffffffffe90;
          CWallet::CommitTransaction(wallet,tx_00,mapValue_00,orderForm);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&stack0xfffffffffffffe78);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&local_118);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_168);
          uVar1 = *(undefined8 *)
                   ((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          uVar2 = *(undefined8 *)
                   (((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          uVar3 = *(undefined8 *)
                   (((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          *(undefined8 *)((bumped_txid->super_base_blob<256U>).m_data._M_elems + 0x10) =
               *(undefined8 *)
                (((tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          *(undefined8 *)((bumped_txid->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar3;
          *(undefined8 *)(bumped_txid->super_base_blob<256U>).m_data._M_elems = uVar1;
          *(undefined8 *)((bumped_txid->super_base_blob<256U>).m_data._M_elems + 8) = uVar2;
          bVar4 = CWallet::MarkReplaced
                            (wallet,(uint256 *)
                                    (*(long *)((long)&((_Var6._M_cur)->
                                                                                                            
                                                  super__Hash_node_value<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_uint256,_wallet::CWalletTx>_>
                                                  ._M_storage._M_storage + 0x1b8) + 0x39),
                             bumped_txid);
          if (!bVar4) {
            std::__cxx11::string::string<std::allocator<char>>
                      (local_138,
                       "Created new bumpfee transaction but could not mark the original transaction as replaced"
                       ,(allocator<char> *)&local_e8);
            original._M_string_length = (size_type)p_Var7;
            original._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
            original.field_2 = in_stack_fffffffffffffe78;
            Untranslated(&local_78,original);
            std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
                      (errors,&local_78);
            bilingual_str::~bilingual_str(&local_78);
            std::__cxx11::string::~string(local_138);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree(&mapValue._M_t);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          RVar5 = OK;
        }
        goto LAB_0022a5b2;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              (local_98,"Invalid or non-wallet transaction id",(allocator<char> *)&mapValue);
    original_00._M_string_length = in_stack_fffffffffffffe70;
    original_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffe68;
    original_00.field_2 = in_stack_fffffffffffffe78;
    Untranslated(&local_78,original_00);
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::emplace_back<bilingual_str>
              (errors,&local_78);
    bilingual_str::~bilingual_str(&local_78);
    std::__cxx11::string::~string(local_98);
  }
LAB_0022a5b2:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock4.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return RVar5;
  }
  __stack_chk_fail();
}

Assistant:

Result CommitTransaction(CWallet& wallet, const uint256& txid, CMutableTransaction&& mtx, std::vector<bilingual_str>& errors, uint256& bumped_txid)
{
    LOCK(wallet.cs_wallet);
    if (!errors.empty()) {
        return Result::MISC_ERROR;
    }
    auto it = txid.IsNull() ? wallet.mapWallet.end() : wallet.mapWallet.find(txid);
    if (it == wallet.mapWallet.end()) {
        errors.push_back(Untranslated("Invalid or non-wallet transaction id"));
        return Result::MISC_ERROR;
    }
    const CWalletTx& oldWtx = it->second;

    // make sure the transaction still has no descendants and hasn't been mined in the meantime
    Result result = PreconditionChecks(wallet, oldWtx, /* require_mine=*/ false, errors);
    if (result != Result::OK) {
        return result;
    }

    // commit/broadcast the tx
    CTransactionRef tx = MakeTransactionRef(std::move(mtx));
    mapValue_t mapValue = oldWtx.mapValue;
    mapValue["replaces_txid"] = oldWtx.GetHash().ToString();

    wallet.CommitTransaction(tx, std::move(mapValue), oldWtx.vOrderForm);

    // mark the original tx as bumped
    bumped_txid = tx->GetHash();
    if (!wallet.MarkReplaced(oldWtx.GetHash(), bumped_txid)) {
        errors.push_back(Untranslated("Created new bumpfee transaction but could not mark the original transaction as replaced"));
    }
    return Result::OK;
}